

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,TransactionStatement *stmt)

{
  _Head_base<0UL,_duckdb::TransactionInfo_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  StatementProperties *pSVar3;
  pointer pTVar4;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> this_00
  ;
  unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_89;
  LogicalType local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  pSVar3 = GetStatementProperties(this);
  this_01 = &stmt->info;
  pTVar4 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->(this_01);
  pSVar3->requires_valid_transaction = (pTVar4->super_ParseInfo).field_0x9 == '\x01';
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Success","");
  __l._M_len = 1;
  __l._M_array = &local_68;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88,__l,&local_89);
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_88.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_88.id_ = INVALID;
  local_88.physical_type_ = ~INVALID;
  local_88._2_6_ = 0;
  local_88.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_88,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = &local_88;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l_00,(allocator_type *)&local_89);
  local_68._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_68._M_string_length =
       (size_type)
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_88);
  this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x70);
  _Var1._M_head_impl =
       (this_01->
       super_unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>
       .super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>.
  super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl = (TransactionInfo *)0x0;
  LogicalOperator::LogicalOperator
            ((LogicalOperator *)
             this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
             LOGICAL_TRANSACTION);
  *(undefined ***)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &PTR__LogicalSimple_02488638;
  ((LogicalOperator *)
  ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
  _vptr_LogicalOperator = (_func_int **)_Var1._M_head_impl;
  _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  pSVar3->return_type = NOTHING;
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(TransactionStatement &stmt) {
	auto &properties = GetStatementProperties();

	// Transaction statements do not require a valid transaction.
	properties.requires_valid_transaction = stmt.info->type == TransactionType::BEGIN_TRANSACTION;

	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_TRANSACTION, std::move(stmt.info));
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}